

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

VkImageAspectFlags vkt::api::anon_unknown_0::getAspectFlags(TextureFormat format)

{
  bool bVar1;
  uint uVar2;
  undefined4 local_14;
  undefined4 uStack_10;
  VkImageAspectFlags aspectFlag;
  TextureFormat format_local;
  
  uStack_10 = format.order;
  bVar1 = tcu::hasDepthComponent(uStack_10);
  uVar2 = 0;
  if (bVar1) {
    uVar2 = 2;
  }
  bVar1 = tcu::hasStencilComponent(uStack_10);
  local_14 = 0;
  if (bVar1) {
    local_14 = 4;
  }
  local_14 = local_14 | uVar2;
  if (local_14 == 0) {
    local_14 = 1;
  }
  return local_14;
}

Assistant:

VkImageAspectFlags getAspectFlags (tcu::TextureFormat format)
{
	VkImageAspectFlags	aspectFlag	= 0;
	aspectFlag |= (tcu::hasDepthComponent(format.order)? VK_IMAGE_ASPECT_DEPTH_BIT : 0);
	aspectFlag |= (tcu::hasStencilComponent(format.order)? VK_IMAGE_ASPECT_STENCIL_BIT : 0);

	if (!aspectFlag)
		aspectFlag = VK_IMAGE_ASPECT_COLOR_BIT;

	return aspectFlag;
}